

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

uint8_t av1_get_txb_entropy_context(tran_low_t *qcoeff,SCAN_ORDER *scan_order,int eob)

{
  int iVar1;
  int in_EDX;
  long *in_RSI;
  int *in_RDI;
  int c;
  int cul_level;
  int16_t *scan;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  uint8_t local_1;
  
  local_28 = *in_RSI;
  local_2c = 0;
  if (in_EDX == 0) {
    local_1 = '\0';
  }
  else {
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      iVar1 = in_RDI[*(short *)(local_28 + (long)local_30 * 2)];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      local_2c = iVar1 + local_2c;
      if (7 < local_2c) break;
    }
    if (local_2c < 8) {
      local_34 = local_2c;
    }
    else {
      local_34 = 7;
    }
    local_2c = local_34;
    set_dc_sign(&local_2c,*in_RDI);
    local_1 = (uint8_t)local_2c;
  }
  return local_1;
}

Assistant:

uint8_t av1_get_txb_entropy_context(const tran_low_t *qcoeff,
                                    const SCAN_ORDER *scan_order, int eob) {
  const int16_t *const scan = scan_order->scan;
  int cul_level = 0;
  int c;

  if (eob == 0) return 0;
  for (c = 0; c < eob; ++c) {
    cul_level += abs(qcoeff[scan[c]]);
    if (cul_level > COEFF_CONTEXT_MASK) break;
  }

  cul_level = AOMMIN(COEFF_CONTEXT_MASK, cul_level);
  set_dc_sign(&cul_level, qcoeff[0]);

  return (uint8_t)cul_level;
}